

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O1

void __thiscall
mjs::anon_unknown_46::json_lexer::throw_unexpected(json_lexer *this,json_token *token)

{
  long *plVar1;
  undefined4 uVar2;
  wostream *pwVar3;
  native_error_exception *this_00;
  global_object *this_01;
  wostringstream *this_02;
  wstring_view *s;
  char *pcVar4;
  wostringstream woss;
  wstring local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  pointer local_1c0;
  wstring_view local_1a8;
  wostringstream local_198 [376];
  
  this_02 = local_198;
  std::__cxx11::wostringstream::wostringstream(this_02);
  std::operator<<((wostream *)this_02,"Unexpected ");
  if (token->type_ == eof) {
    pcVar4 = "end of input";
    goto LAB_0014757a;
  }
  pwVar3 = std::operator<<((wostream *)local_198,"token ");
  switch(token->type_) {
  case whitespace:
    pcVar4 = "whitespace";
    break;
  case string:
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) {
      std::__throw_bad_cast();
    }
    local_1f8._M_dataplus._M_p._0_4_ = (**(code **)(*plVar1 + 0x50))(plVar1,0x22);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar3,(wchar_t *)&local_1f8,1);
    if (1 < token->type_ - string) {
LAB_001477a4:
      __assert_fail("type_ == json_token_type::string || type_ == json_token_type::number",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x41,"const std::wstring &mjs::(anonymous namespace)::json_token::text() const"
                   );
    }
    local_1c0 = (token->text_)._M_dataplus._M_p;
    local_1c8 = (wchar_t *)(token->text_)._M_string_length;
    cpp_quote_abi_cxx11_(&local_1f8,(mjs *)&local_1c8,s);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar3,(wchar_t *)
                               CONCAT44(local_1f8._M_dataplus._M_p._4_4_,
                                        local_1f8._M_dataplus._M_p._0_4_),local_1f8._M_string_length
                       );
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 == (long *)0x0) {
      std::__throw_bad_cast();
    }
    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x22);
    local_1d8._M_len = CONCAT44(local_1d8._M_len._4_4_,uVar2);
    this_02 = (wostringstream *)
              std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                        (pwVar3,(wchar_t *)&local_1d8,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)CONCAT44(local_1f8._M_dataplus._M_p._4_4_,local_1f8._M_dataplus._M_p._0_4_) !=
        &local_1f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f8._M_dataplus._M_p._4_4_,local_1f8._M_dataplus._M_p._0_4_),
                      local_1f8.field_2._M_allocated_capacity * 4 + 4);
    }
    goto LAB_00147725;
  case number:
    if (1 < token->type_ - string) goto LAB_001477a4;
    this_02 = (wostringstream *)
              std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                        (pwVar3,(token->text_)._M_dataplus._M_p,(token->text_)._M_string_length);
    goto LAB_00147725;
  case null:
    pcVar4 = "null";
    break;
  case false_:
    pcVar4 = "false";
    break;
  case true_:
    pcVar4 = "true";
    break;
  case lbracket:
    pcVar4 = "lbracket";
    break;
  case rbracket:
    pcVar4 = "rbracket";
    break;
  case lbrace:
    pcVar4 = "lbrace";
    break;
  case rbrace:
    pcVar4 = "rbrace";
    break;
  case comma:
    pcVar4 = "comma";
    break;
  case colon:
    pcVar4 = "colon";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                  ,0x32,
                  "std::wostream &mjs::(anonymous namespace)::operator<<(std::wostream &, json_token_type)"
                 );
  }
  this_02 = (wostringstream *)std::operator<<(pwVar3,pcVar4);
LAB_00147725:
  pcVar4 = " in JSON";
LAB_0014757a:
  std::operator<<((wostream *)this_02,pcVar4);
  pwVar3 = std::operator<<((wostream *)local_198," at position ");
  std::wostream::_M_insert<unsigned_long>((ulong)pwVar3);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  global_object::stack_trace_abi_cxx11_(&local_1f8,this_01);
  local_1d8._M_str =
       (wchar_t *)CONCAT44(local_1f8._M_dataplus._M_p._4_4_,local_1f8._M_dataplus._M_p._0_4_);
  local_1d8._M_len = local_1f8._M_string_length;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = (size_t)local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_00,syntax,&local_1d8,&local_1a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

[[noreturn]] void throw_unexpected(const json_token& token) {
        std::wostringstream woss;
        woss << "Unexpected ";
        if (token.type() == json_token_type::eof) {
            woss << "end of input";
        } else {
            woss << "token " << token << " in JSON";
        }
        woss << " at position " << token.pos();
        throw native_error_exception{native_error_type::syntax, global()->stack_trace(), woss.str()};
    }